

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsboxd.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Daemon *this;
  pointer *__ptr;
  char *pcVar2;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"stop");
    if (iVar1 == 0) {
      pcVar2 = "(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid";
    }
    else {
      iVar1 = strcmp(pcVar2,"kill");
      if (iVar1 == 0) {
        pcVar2 = "(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid";
      }
      else {
        iVar1 = strcmp(pcVar2,"killall");
        if (iVar1 != 0) goto LAB_001091a7;
        pcVar2 = "rm /run/libsboxd.pid; killall libsboxd -s SIGKILL";
      }
    }
    iVar1 = system(pcVar2);
    _exit(iVar1);
  }
LAB_001091a7:
  this = (Daemon *)operator_new(0x80);
  (this->super_ContextManager)._vptr_ContextManager = (_func_int **)0x0;
  (this->super_ContextManager).name_._M_dataplus._M_p = (pointer)0x0;
  (this->super_ContextManager).name_._M_string_length = 0;
  (this->super_ContextManager).name_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->super_ContextManager).name_.field_2 + 8) = 0;
  (this->socket_path_)._M_pathname._M_dataplus._M_p = (pointer)0x0;
  (this->socket_path_)._M_pathname._M_string_length = 0;
  (this->socket_path_)._M_pathname.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->socket_path_)._M_pathname.field_2 + 8) = 0;
  (this->socket_path_)._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (_Impl *)0x0;
  *(undefined8 *)&this->server_socket_fd_ = 0;
  (this->id_getter_)._M_t.
  super___uniq_ptr_impl<SharedIdGetter,_std::default_delete<SharedIdGetter>_>._M_t.
  super__Tuple_impl<0UL,_SharedIdGetter_*,_std::default_delete<SharedIdGetter>_>.
  super__Head_base<0UL,_SharedIdGetter_*,_false>._M_head_impl = (SharedIdGetter *)0x0;
  this->terminated_ = false;
  *(undefined3 *)&this->field_0x61 = 0;
  this->num_boxes_ = 0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ContextManager).name_._M_dataplus._M_p =
       (pointer)&(this->super_ContextManager).name_.field_2;
  (this->super_ContextManager).name_._M_string_length = 0;
  (this->super_ContextManager).name_.field_2._M_local_buf[0] = '\0';
  (this->super_ContextManager)._vptr_ContextManager = (_func_int **)&PTR__die_0014d768;
  std::filesystem::__cxx11::path::path(&this->socket_path_);
  this->server_socket_fd_ = 0;
  (this->id_getter_)._M_t.
  super___uniq_ptr_impl<SharedIdGetter,_std::default_delete<SharedIdGetter>_>._M_t.
  super__Tuple_impl<0UL,_SharedIdGetter_*,_std::default_delete<SharedIdGetter>_>.
  super__Head_base<0UL,_SharedIdGetter_*,_false>._M_head_impl = (SharedIdGetter *)0x0;
  this->terminated_ = false;
  *(undefined8 *)&this->num_boxes_ = 0;
  *(undefined8 *)
   ((long)&(this->workers_).
           super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<Worker,_std::default_delete<Worker>_>,_std::allocator<std::unique_ptr<Worker,_std::default_delete<Worker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Daemon::run(this);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 2 && strcmp(argv[1], "stop") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "kill") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "killall") == 0) {
        _exit(system("rm /run/libsboxd.pid; killall libsboxd -s SIGKILL"));
    }

    std::make_unique<Daemon>()->run();
}